

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::NotLookingAt_<kj::parse::CharGroup_>::operator()
          (NotLookingAt_<kj::parse::CharGroup_> *this,IteratorInput<char,_const_char_*> *input)

{
  long in_RDX;
  undefined1 local_2a [10];
  Bits64 local_20;
  Bits64 local_18;
  Bits64 local_10;
  
  local_20 = *(undefined8 *)(in_RDX + 8);
  local_18 = *(undefined8 *)(in_RDX + 0x10);
  local_2a._2_8_ = 0;
  local_10 = local_20;
  CharGroup_::operator()((CharGroup_ *)local_2a,input);
  *(byte *)(this->subParser).bits = local_2a[0] ^ 1;
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_2a + 2));
  return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
}

Assistant:

Maybe<Tuple<>> operator()(Input& input) const {
    Input subInput(input);
    subInput.forgetParent();
    if (subParser(subInput) == nullptr) {
      return Tuple<>();
    } else {
      return nullptr;
    }
  }